

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O1

bool DirOpus(Disk *disk)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Sector *pSVar7;
  Data *pDVar8;
  ulong uVar9;
  uint uVar10;
  OPD_BOOT *ob;
  size_type *psVar11;
  string name;
  int start;
  Format fmt;
  string local_f0;
  int local_cc;
  uint local_c8;
  uint local_c4;
  string local_c0;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  uint local_88;
  uint local_84;
  int local_80;
  int local_7c;
  Disk *local_78;
  Format local_6c;
  
  local_78 = disk;
  Format::Format(&local_6c,OPD);
  paVar1 = &local_c0.field_2;
  local_c4 = 1;
  local_c8 = 1;
  local_90 = 0;
  local_98 = 0;
  local_cc = 1;
  uVar9 = 0;
  do {
    Header::Header((Header *)&local_f0,0,0,(int)uVar9,1);
    pSVar7 = Disk::get_sector(local_78,(Header *)&local_f0);
    pDVar8 = Sector::data_copy(pSVar7,0);
    puVar2 = (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a0 = uVar9;
    if ((int)uVar9 == 0) {
      local_c4 = (uint)puVar2[2];
      local_c8 = (uint)puVar2[3];
      Format::Validate(local_c4,2 - (uint)((puVar2[4] & 0x10) == 0),local_c8,0x200,0);
      uVar6 = 0;
    }
    else {
      iVar3 = Format::sector_size(&local_6c);
      iVar4 = iVar3 + 0xf;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      if (0xf < iVar3) {
        local_80 = iVar4 >> 4;
        psVar11 = (size_type *)(puVar2 + 6);
        iVar4 = 0;
        do {
          uVar10 = (uint)*(byte *)((long)psVar11 + -4) | (*(byte *)((long)psVar11 + -3) & 0xf) << 8;
          uVar6 = (uint)local_90;
          iVar3 = (int)local_98;
          local_7c = iVar4;
          if (*(ushort *)((long)psVar11 + -2) == 0xffff) {
            local_84 = uVar6 - 1;
            iVar4 = local_cc * local_80;
            local_88 = iVar3 + 1;
            iVar5 = Format::sector_size(&local_6c);
            util::fmt_abi_cxx11_
                      (&local_f0,"\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                       (ulong)local_84,(ulong)(~uVar6 + iVar4),(ulong)local_88,
                       (ulong)(uVar10 - iVar3),(int)(uVar10 - iVar3) / (int)(0x400 / (long)iVar5));
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
                &local_f0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),
                              local_f0.field_2._M_allocated_capacity + 1);
            }
            uVar6 = 1;
            goto LAB_0014a2fc;
          }
          local_90 = (ulong)(uVar6 + 1);
          iVar5 = *(ushort *)((long)psVar11 + -2) - uVar10;
          local_98 = (ulong)(iVar3 + iVar5 + 1);
          if ((int)local_a0 == 1 && iVar4 == 0) {
            local_c0.field_2._8_2_ = (undefined2)psVar11[1];
            local_c0.field_2._M_allocated_capacity = *psVar11;
            local_c0._M_string_length = 10;
            local_c0.field_2._M_local_buf[10] = '\0';
            local_c0._M_dataplus._M_p = (pointer)paVar1;
            util::trim(&local_f0,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            util::fmt_abi_cxx11_
                      (&local_c0,"%.10s:\n\n",
                       CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_));
            util::operator<<((LogHelper *)&util::cout,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
                &local_f0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),
                              local_f0.field_2._M_allocated_capacity + 1);
            }
            uVar6 = 7;
            local_cc = iVar5;
            goto LAB_0014a2fc;
          }
          util::fmt_abi_cxx11_(&local_f0,"%-10.10s  ",psVar11);
          util::operator<<((LogHelper *)&util::cout,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
              &local_f0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_
                                    ),local_f0.field_2._M_allocated_capacity + 1);
          }
          uVar9 = (ulong)(uVar10 + 1) / (ulong)local_c8;
          Header::Header((Header *)&local_f0,(int)(uVar9 % (ulong)local_c4),(int)(uVar9 / local_c4),
                         (uVar10 + 1) % local_c8 + local_6c.base,1);
          pSVar7 = Disk::get_sector(local_78,(Header *)&local_f0);
          pDVar8 = Sector::data_copy(pSVar7,0);
          puVar2 = (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_c0._M_dataplus._M_p._0_4_ = (uint)*(ushort *)(puVar2 + 3);
          switch(*puVar2) {
          case '\0':
            util::operator<<((LogHelper *)&util::cout,(char (*) [8])"BASIC  ");
            if ((int)(uint)local_c0._M_dataplus._M_p < 10000) {
              util::operator<<((LogHelper *)&util::cout,(int *)&local_c0);
            }
            goto LAB_0014a2ea;
          case '\x01':
            util::fmt_abi_cxx11_
                      (&local_f0,"DATA   %c()",(ulong)((puVar2[4] & 0x3f) + 0x60),(ulong)puVar2[2]);
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            break;
          case '\x02':
            util::fmt_abi_cxx11_
                      (&local_f0,"DATA   %c$()",(ulong)((puVar2[4] & 0x3f) + 0x60),(ulong)puVar2[2])
            ;
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            break;
          case '\x03':
            util::fmt_abi_cxx11_
                      (&local_f0,"CODE   %5u,%u",(ulong)(uint)*(ushort *)(puVar2 + 3),
                       (ulong)*(ushort *)(puVar2 + 1));
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            break;
          default:
            util::operator<<((LogHelper *)&util::cout,(char (*) [4])"???");
            goto LAB_0014a2ea;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
              &local_f0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_
                                    ),local_f0.field_2._M_allocated_capacity + 1);
          }
LAB_0014a2ea:
          local_f0._M_dataplus._M_p._0_1_ = 10;
          util::operator<<((LogHelper *)&util::cout,(char *)&local_f0);
          uVar6 = 0;
LAB_0014a2fc:
          if ((uVar6 != 7) && (uVar6 != 0)) goto LAB_0014a320;
          iVar4 = local_7c + 1;
          psVar11 = psVar11 + 2;
        } while (local_80 != iVar4);
      }
      uVar6 = 5;
LAB_0014a320:
      if (uVar6 == 5) {
        uVar6 = 0;
      }
    }
    if (((uVar6 & 3) != 0) || (uVar9 = (ulong)((int)local_a0 + 1), local_cc <= (int)local_a0)) {
      return true;
    }
  } while( true );
}

Assistant:

bool DirOpus(Disk& disk)
{
    Format fmt{ RegularFormat::OPD };

    auto cyls = 1, heads = 1, sectors = 1;
    auto uFiles = 0, uBlocks = 0;
    auto cat_blocks = 1;

    for (auto i = 0; i <= cat_blocks; ++i)
    {
        auto& sector = disk.get_sector(Header(0, 0, i, 1));
        auto& data = sector.data_copy();

        // First sector has disk geometry
        if (i == 0)
        {
            auto& ob = *reinterpret_cast<const OPD_BOOT*>(data.data());
            cyls = ob.cyls;
            heads = (ob.flags & 0x10) ? 2 : 1;
            sectors = ob.sectors;

            Format::Validate(cyls, heads, sectors);
            continue;
        }

        auto pd = reinterpret_cast<const OPUS_DIR*>(data.data());
        auto dir_entries = fmt.sector_size() / static_cast<int>(sizeof(OPUS_DIR));

        for (auto j = 0; j < dir_entries; ++j, ++pd)
        {
            // Extract the catalogue entry contents
            auto uFirstBlock = ((pd->first_block[1] & 0x0f) << 8) | pd->first_block[0];
            auto uLastBlock = (pd->last_block[1] << 8) | pd->last_block[0];
            //          auto uLastBlockSize = (pd->last_block_size[1] << 8) | pd->last_block_size[0];   // unused here

                        // Directory terminator?
            if (uLastBlock == 0xffff)
            {
                // Don't include catalogue and end marker in file count
                util::cout << util::fmt("\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                    uFiles - 1, cat_blocks * dir_entries - uFiles - 1, uBlocks + 1,
                    uFirstBlock - uBlocks, (uFirstBlock - uBlocks) / (1024 / fmt.sector_size()));
                return true;
            }

            ++uFiles;
            uBlocks += uLastBlock - uFirstBlock + 1;

            // The first entry in the catalogue is the label
            if (i == 1 && !j)
            {
                auto name = util::trim(std::string(pd->szName, sizeof(pd->szName)));
                util::cout << util::fmt("%.10s:\n\n", name.c_str());

                // Update the real number of blocks in the catalogue
                // The first block isn't directory, so subtract an extra 1
                cat_blocks = uLastBlock - uFirstBlock + 1 - 1;
                continue;
            }

            // Output the filename (we don't expand keywords yet)
            util::cout << util::fmt("%-10.10s  ", pd->szName);

            // ToDo: suppress extra info on physical disks, due to seek overhead?
//          if (true)
            {
                // Locate the first sector of the file, which starts with a header
                auto cyl = (++uFirstBlock / sectors) % cyls;
                auto head = (uFirstBlock / sectors) / cyls;
                auto sec = (uFirstBlock % sectors) + fmt.base;

                auto& sectorS = disk.get_sector(Header(cyl, head, sec, 1));
                auto& dataS = sectorS.data_copy();

                // Extract the file type, start and length
                auto type = dataS[0];
                auto length = (dataS[2] << 8) | dataS[1];
                auto start = (dataS[4] << 8) | dataS[3];
                //              auto uUnk = (dataS[6] << 8) | dataS[5];

                                // Display type-dependent information
                switch (type)
                {
                case 0: util::cout << "BASIC  "; if (start < 10000) util::cout << start; break;
                case 1: util::cout << util::fmt("DATA   %c()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 2: util::cout << util::fmt("DATA   %c$()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 3: util::cout << util::fmt("CODE   %5u,%u", start, length); break;
                default: util::cout << "???"; break;
                }
            }

            util::cout << '\n';
        }
    }

    return true;
}